

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_skip_(char *file,int line,char *fmt,...)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDX;
  uint in_ESI;
  char *in_RDI;
  int result_color;
  char *result_str;
  size_t reason_len;
  va_list args;
  undefined4 in_stack_ffffffffffffff00;
  acutest_state_ in_stack_ffffffffffffff04;
  
  vsnprintf(acutest_test_skip_reason_,0x100,in_RDX,&stack0xffffffffffffffc8);
  acutest_test_skip_reason_[0xff] = '\0';
  sVar1 = strlen(acutest_test_skip_reason_);
  if (*(char *)(sVar1 + 0x1a316f) == '.') {
    *(undefined1 *)(sVar1 + 0x1a316f) = 0;
  }
  if (acutest_test_check_count_ < 1) {
    if (1 < acutest_verbose_level_) {
      if ((acutest_test_already_logged_ == 0) && (acutest_current_test_ != (acutest_test_ *)0x0)) {
        acutest_finish_test_line_(in_stack_ffffffffffffff04);
      }
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
      acutest_line_indent_(0);
      if (in_RDI != (char *)0x0) {
        pcVar2 = acutest_basename_((char *)CONCAT44(in_stack_ffffffffffffff04,
                                                    in_stack_ffffffffffffff00));
        printf("%s:%d: ",pcVar2,(ulong)in_ESI);
      }
      printf("%s... ",acutest_test_skip_reason_);
      acutest_colored_printf_(3,"%s","skipped");
      printf("\n");
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
    }
    acutest_test_skip_count_ = acutest_test_skip_count_ + 1;
  }
  else {
    acutest_check_(0,in_RDI,(int)(ulong)in_ESI,"Cannot skip, already performed some checks");
  }
  return;
}

Assistant:

acutest_skip_(const char* file, int line, const char* fmt, ...)
{
    va_list args;
    size_t reason_len;

    va_start(args, fmt);
    vsnprintf(acutest_test_skip_reason_, sizeof(acutest_test_skip_reason_), fmt, args);
    va_end(args);
    acutest_test_skip_reason_[sizeof(acutest_test_skip_reason_)-1] = '\0';

    /* Remove final dot, if provided; that collides with our other logic. */
    reason_len = strlen(acutest_test_skip_reason_);
    if(acutest_test_skip_reason_[reason_len-1] == '.')
        acutest_test_skip_reason_[reason_len-1] = '\0';

    if(acutest_test_check_count_ > 0) {
        acutest_check_(0, file, line, "Cannot skip, already performed some checks");
        return;
    }

    if(acutest_verbose_level_ >= 2) {
        const char *result_str = "skipped";
        int result_color = ACUTEST_COLOR_YELLOW_;

        if(!acutest_test_already_logged_  &&  acutest_current_test_ != NULL)
            acutest_finish_test_line_(ACUTEST_STATE_SKIPPED);
        acutest_test_already_logged_++;

        acutest_line_indent_(1);

        if(file != NULL) {
            file = acutest_basename_(file);
            printf("%s:%d: ", file, line);
        }

        printf("%s... ", acutest_test_skip_reason_);
        acutest_colored_printf_(result_color, "%s", result_str);
        printf("\n");
        acutest_test_already_logged_++;
    }

    acutest_test_skip_count_++;
}